

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

ssize_t __thiscall
event_track::EventSample::write(EventSample *this,int __fd,void *__buf,size_t __n)

{
  pointer pEVar1;
  ssize_t sVar2;
  size_t __n_00;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  pointer pEVar4;
  size_t t_size;
  long lVar5;
  
  if (this->is_emeb_ == false) {
    pEVar4 = (this->instance_boxes_).
             super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->instance_boxes_).
             super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar1 != pEVar4) {
      lVar5 = 0;
      for (__n_00 = 0; __n_00 < (ulong)(((long)pEVar1 - (long)pEVar4) / 0xd8);
          __n_00 = (size_t)((int)__n_00 + 1)) {
        sVar2 = EventMessageInstanceBox::write
                          (pEVar4 + __n_00,__fd,(void *)(((long)pEVar1 - (long)pEVar4) % 0xd8),
                           __n_00);
        lVar5 = lVar5 + sVar2;
        pEVar4 = (this->instance_boxes_).
                 super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar1 = (this->instance_boxes_).
                 super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      return lVar5;
    }
  }
  puVar3 = &emeb;
  if (this->is_vtt_ != false) {
    puVar3 = &vtte;
  }
  std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),(long)puVar3);
  return 8;
}

Assistant:

size_t write(std::ostream &ostr)
		{
			if (is_emeb_ || instance_boxes_.size() == 0) 
			{
				if (!is_vtt_)
				    ostr.write((const char *)&emeb[0], 8);
				else
					ostr.write((const char*)&vtte[0], 8);
				return 8;
			}
			else 
			{
				size_t t_size = 0;
				for (unsigned int y = 0; y < instance_boxes_.size(); y++)
					t_size+=instance_boxes_[y].write(ostr);
				return t_size;
			}
		}